

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O3

uint32_t do_helper_oc(CPUS390XState_conflict *env,uint32_t l,uint64_t dest,uint64_t src,uintptr_t ra
                     )

{
  int size;
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  S390Access local_a8;
  S390Access local_80;
  S390Access local_58;
  
  uVar1 = (env->psw).mask;
  iVar6 = 3;
  if ((uVar1 >> 0x3a & 1) != 0) {
    switch((uint)(uVar1 >> 0x2e) & 3) {
    case 0:
      iVar6 = 0;
      break;
    case 1:
      abort();
    case 2:
      iVar6 = 1;
      break;
    case 3:
      iVar6 = 2;
    }
  }
  size = l + 1;
  access_prepare(&local_58,env,src,size,MMU_DATA_LOAD,iVar6,ra);
  access_prepare(&local_80,env,dest,size,MMU_DATA_LOAD,iVar6,ra);
  access_prepare(&local_a8,env,dest,size,MMU_DATA_STORE,iVar6,ra);
  uVar4 = 0;
  if (l != 0xffffffff) {
    bVar5 = 0;
    iVar6 = 0;
    do {
      bVar2 = access_get_byte(env,&local_58,iVar6,ra);
      bVar3 = access_get_byte(env,&local_80,iVar6,ra);
      bVar5 = bVar5 | bVar3 | bVar2;
      access_set_byte(env,&local_a8,iVar6,bVar3 | bVar2,ra);
      iVar6 = iVar6 + 1;
    } while (l + 1 != iVar6);
    uVar4 = (uint)(bVar5 != 0);
  }
  return uVar4;
}

Assistant:

static uint32_t do_helper_oc(CPUS390XState *env, uint32_t l, uint64_t dest,
                             uint64_t src, uintptr_t ra)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    S390Access srca1, srca2, desta;
    uint32_t i;
    uint8_t c = 0;

    HELPER_LOG("%s l %d dest %" PRIx64 " src %" PRIx64 "\n",
               __func__, l, dest, src);

    /* OC always processes one more byte than specified - maximum is 256 */
    l++;

    srca1 = access_prepare(env, src, l, MMU_DATA_LOAD, mmu_idx, ra);
    srca2 = access_prepare(env, dest, l, MMU_DATA_LOAD, mmu_idx, ra);
    desta = access_prepare(env, dest, l, MMU_DATA_STORE, mmu_idx, ra);
    for (i = 0; i < l; i++) {
        const uint8_t x = access_get_byte(env, &srca1, i, ra) |
                          access_get_byte(env, &srca2, i, ra);

        c |= x;
        access_set_byte(env, &desta, i, x, ra);
    }
    return c != 0;
}